

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_mcu_gather(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  long lVar2;
  long *in_RSI;
  long *in_RDI;
  jpeg_component_info *compptr;
  int ci;
  int blkn;
  huff_entropy_ptr entropy;
  int local_20;
  int local_1c;
  
  lVar2 = in_RDI[0x46];
  if (*(int *)((long)in_RDI + 0x13c) != 0) {
    if (*(int *)(lVar2 + 0x38) == 0) {
      for (local_20 = 0; local_20 < (int)in_RDI[0x2e]; local_20 = local_20 + 1) {
        *(undefined4 *)(lVar2 + 0x24 + (long)local_20 * 4) = 0;
      }
      *(undefined4 *)(lVar2 + 0x38) = *(undefined4 *)((long)in_RDI + 0x13c);
    }
    *(int *)(lVar2 + 0x38) = *(int *)(lVar2 + 0x38) + -1;
  }
  for (local_1c = 0; local_1c < (int)in_RDI[0x34]; local_1c = local_1c + 1) {
    iVar1 = *(int *)((long)in_RDI + (long)local_1c * 4 + 0x1a4);
    htest_one_block((j_compress_ptr)entropy,_ci,compptr._4_4_,in_RDI,in_RSI);
    *(int *)(lVar2 + 0x24 + (long)iVar1 * 4) = (int)*(short *)in_RSI[local_1c];
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_gather (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int blkn, ci;
  jpeg_component_info * compptr;

  /* Take care of restart intervals if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      /* Re-initialize DC predictions to 0 */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++)
	entropy->saved.last_dc_val[ci] = 0;
      /* Update restart state */
      entropy->restarts_to_go = cinfo->restart_interval;
    }
    entropy->restarts_to_go--;
  }

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    htest_one_block(cinfo, MCU_data[blkn][0], entropy->saved.last_dc_val[ci],
		    entropy->dc_count_ptrs[compptr->dc_tbl_no],
		    entropy->ac_count_ptrs[compptr->ac_tbl_no]);
    entropy->saved.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  return TRUE;
}